

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Glucose::Solver::attachClause(Solver *this,CRef cr)

{
  CRef CVar1;
  bool bVar2;
  int iVar3;
  Lit p;
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
  *this_00;
  long lVar4;
  unsigned_long *puVar5;
  CRef in_ESI;
  long in_RDI;
  Clause *c;
  undefined4 in_stack_ffffffffffffff18;
  Ref in_stack_ffffffffffffff1c;
  vec<Glucose::Solver::Watcher> *in_stack_ffffffffffffff20;
  Lit *in_stack_ffffffffffffff28;
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
  *in_stack_ffffffffffffff30;
  Watcher local_64;
  int local_5c;
  int local_58;
  int local_54;
  Watcher local_50;
  int local_48;
  int local_44;
  int local_40;
  Watcher local_3c;
  int local_34;
  int local_30;
  int local_2c;
  Watcher local_28;
  int local_20;
  int local_1c;
  Clause *local_18;
  CRef local_c;
  
  local_c = in_ESI;
  local_18 = ClauseAllocator::operator[]
                       ((ClauseAllocator *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  iVar3 = Clause::size(local_18);
  if (iVar3 == 2) {
    local_20 = (int)Clause::operator[](local_18,0);
    local_1c = (int)operator~((Lit)local_20);
    OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
    ::operator[](in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    CVar1 = local_c;
    local_2c = (int)Clause::operator[](local_18,1);
    Watcher::Watcher(&local_28,CVar1,(Lit)local_2c);
    vec<Glucose::Solver::Watcher>::push
              (in_stack_ffffffffffffff20,
               (Watcher *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    local_34 = (int)Clause::operator[](local_18,1);
    local_30 = (int)operator~((Lit)local_34);
    OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
    ::operator[](in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    local_40 = (int)Clause::operator[](local_18,0);
    Watcher::Watcher(&local_3c,local_c,(Lit)local_40);
    vec<Glucose::Solver::Watcher>::push
              (in_stack_ffffffffffffff20,
               (Watcher *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  else {
    this_00 = (OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
               *)(in_RDI + 0x160);
    local_48 = (int)Clause::operator[](local_18,0);
    local_44 = (int)operator~((Lit)local_48);
    OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
    ::operator[](this_00,in_stack_ffffffffffffff28);
    CVar1 = local_c;
    local_54 = (int)Clause::operator[](local_18,1);
    Watcher::Watcher(&local_50,CVar1,(Lit)local_54);
    vec<Glucose::Solver::Watcher>::push
              (in_stack_ffffffffffffff20,
               (Watcher *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    local_5c = (int)Clause::operator[](local_18,1);
    local_58 = (int)operator~((Lit)local_5c);
    OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
    ::operator[](this_00,in_stack_ffffffffffffff28);
    p = Clause::operator[](local_18,0);
    Watcher::Watcher(&local_64,local_c,p);
    vec<Glucose::Solver::Watcher>::push
              (in_stack_ffffffffffffff20,
               (Watcher *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  bVar2 = Clause::learnt(local_18);
  if (bVar2) {
    iVar3 = Clause::size(local_18);
    lVar4 = (long)iVar3;
    puVar5 = vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0xd0),0x14);
    *puVar5 = lVar4 + *puVar5;
  }
  else {
    iVar3 = Clause::size(local_18);
    lVar4 = (long)iVar3;
    puVar5 = vec<unsigned_long>::operator[]((vec<unsigned_long> *)(in_RDI + 0xd0),0x13);
    *puVar5 = lVar4 + *puVar5;
  }
  return;
}

Assistant:

void Solver::attachClause(CRef cr) {
    const Clause &c = ca[cr];

    assert(c.size() > 1);
    if(c.size() == 2) {
        watchesBin[~c[0]].push(Watcher(cr, c[1]));
        watchesBin[~c[1]].push(Watcher(cr, c[0]));
    } else {
        watches[~c[0]].push(Watcher(cr, c[1]));
        watches[~c[1]].push(Watcher(cr, c[0]));
    }
    if(c.learnt()) stats[learnts_literals] += c.size();
    else stats[clauses_literals] += c.size();
}